

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene.cxx
# Opt level: O0

bool __thiscall xray_re::xr_scene::load(xr_scene *this,char *name)

{
  xr_scene_part *this_00;
  xr_file_system *pxVar1;
  bool bVar2;
  uint32_t uVar3;
  scene_chunk_id id;
  xr_reader *pxVar4;
  size_t sVar5;
  reference ppxVar6;
  char *pcVar7;
  xr_reader *local_118;
  xr_reader *s_1;
  xr_guid guid;
  xr_scene_part *part;
  xr_scene_part_vec_it end;
  xr_scene_part_vec_it it;
  undefined1 local_c0 [8];
  string parts_path;
  size_t num_objects;
  xr_reader *s;
  uint32_t version;
  allocator<char> local_71;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  xr_reader *local_30;
  xr_reader *r;
  xr_file_system *fs;
  char *name_local;
  xr_scene *this_local;
  
  fs = (xr_file_system *)name;
  name_local = (char *)this;
  pxVar4 = (xr_reader *)xr_file_system::instance();
  pxVar1 = fs;
  r = pxVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,(char *)pxVar1,&local_71);
  std::operator+(&local_50,&local_70,".level");
  pxVar4 = xr_file_system::r_open((xr_file_system *)pxVar4,"$maps$",&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  if (pxVar4 == (xr_reader *)0x0) {
    this_local._7_1_ = 0;
  }
  else {
    local_30 = pxVar4;
    sVar5 = xr_reader::r_chunk<unsigned_int>(pxVar4,0x9df3,(uint *)&s);
    if (sVar5 == 0) {
      msg("no scene version chunk");
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene.cxx"
                    ,0x118,"bool xray_re::xr_scene::load(const char *)");
    }
    if ((int)s != 5) {
      __assert_fail("version == SCENE_VERSION",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene.cxx"
                    ,0x11a,"bool xray_re::xr_scene::load(const char *)");
    }
    num_objects = (size_t)xr_reader::open_chunk(local_30,0x7711);
    if ((xr_reader *)num_objects == (xr_reader *)0x0) {
      msg("no level options chunk");
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene.cxx"
                    ,0x126,"bool xray_re::xr_scene::load(const char *)");
    }
    load_options(this,(xr_reader *)num_objects);
    xr_reader::close_chunk(local_30,(xr_reader **)&num_objects);
    sVar5 = xr_reader::find_chunk(local_30,0x7709);
    if (sVar5 == 0) {
      msg("no scene camera chunk");
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene.cxx"
                    ,0x12f,"bool xray_re::xr_scene::load(const char *)");
    }
    xr_reader::r_fvector3(local_30,&this->m_camera_pos);
    xr_reader::r_fvector3(local_30,&this->m_camera_orient);
    xr_reader::debug_find_chunk(local_30);
    sVar5 = xr_reader::r_chunk<xray_re::xr_guid>(local_30,0x7000,&this->m_guid);
    if (sVar5 == 0) {
      msg("no tools GUID chunk");
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene.cxx"
                    ,0x134,"bool xray_re::xr_scene::load(const char *)");
    }
    xr_scene_revision::load(&this->m_revision,local_30);
    sVar5 = xr_reader::find_chunk(local_30,0x7712);
    if (sVar5 != 0) {
      xr_reader::r_u32(local_30);
      xr_reader::debug_find_chunk(local_30);
    }
    load_objects(this,local_30,0x7708,&this->m_objects);
    sVar5 = xr_reader::find_chunk(local_30,0x7710);
    pxVar4 = local_30;
    if (sVar5 != 0) {
      uVar3 = xr_reader::r_u32(local_30);
      xr_reader::
      r_seq<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,xray_re::xr_reader::f_r_sz>
                (pxVar4,uVar3,&this->m_snap_objects);
    }
    xr_file_system::r_close((xr_file_system *)r,&local_30);
    pxVar1 = fs;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_c0,(char *)pxVar1,(allocator<char> *)((long)&it._M_current + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&it._M_current + 7));
    std::__cxx11::string::operator+=((string *)local_c0,'\\');
    end._M_current =
         (xr_scene_part **)
         std::vector<xray_re::xr_scene_part_*,_std::allocator<xray_re::xr_scene_part_*>_>::begin
                   (&this->m_parts);
    part = (xr_scene_part *)
           std::vector<xray_re::xr_scene_part_*,_std::allocator<xray_re::xr_scene_part_*>_>::end
                     (&this->m_parts);
    while (bVar2 = __gnu_cxx::operator!=
                             (&end,(__normal_iterator<xray_re::xr_scene_part_**,_std::vector<xray_re::xr_scene_part_*,_std::allocator<xray_re::xr_scene_part_*>_>_>
                                    *)&part), bVar2) {
      ppxVar6 = __gnu_cxx::
                __normal_iterator<xray_re::xr_scene_part_**,_std::vector<xray_re::xr_scene_part_*,_std::allocator<xray_re::xr_scene_part_*>_>_>
                ::operator*(&end);
      pxVar4 = r;
      this_00 = *ppxVar6;
      pcVar7 = xr_scene_part::file_name(this_00);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (guid.g + 2),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0,
                     pcVar7);
      local_30 = xr_file_system::r_open((xr_file_system *)pxVar4,"$maps$",(string *)(guid.g + 2));
      std::__cxx11::string::~string((string *)(guid.g + 2));
      if (local_30 == (xr_reader *)0x0) {
        pcVar7 = xr_scene_part::file_name(this_00);
        msg("can\'t load scene part %s",pcVar7);
      }
      if (local_30 == (xr_reader *)0x0) {
        __assert_fail("r",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene.cxx"
                      ,0x14f,"bool xray_re::xr_scene::load(const char *)");
      }
      sVar5 = xr_reader::r_chunk<xray_re::xr_guid>(local_30,0x7000,(xr_guid *)&s_1);
      if ((sVar5 == 0) ||
         (bVar2 = xr_guid::operator!=((xr_guid *)&s_1,&this->m_guid), pxVar4 = local_30, bVar2)) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene.cxx"
                      ,0x152,"bool xray_re::xr_scene::load(const char *)");
      }
      id = xr_scene_part::chunk_id(this_00);
      local_118 = xr_reader::open_chunk(pxVar4,id);
      if (local_118 == (xr_reader *)0x0) {
        __assert_fail("s",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene.cxx"
                      ,0x155,"bool xray_re::xr_scene::load(const char *)");
      }
      if (local_118 != (xr_reader *)0x0) {
        (*this_00->_vptr_xr_scene_part[2])(this_00,local_118);
        xr_reader::close_chunk(local_30,&local_118);
      }
      xr_file_system::r_close((xr_file_system *)r,&local_30);
      __gnu_cxx::
      __normal_iterator<xray_re::xr_scene_part_**,_std::vector<xray_re::xr_scene_part_*,_std::allocator<xray_re::xr_scene_part_*>_>_>
      ::operator++(&end);
    }
    this_local._7_1_ = 1;
    std::__cxx11::string::~string((string *)local_c0);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool xr_scene::load(const char* name)
{
	xr_file_system& fs = xr_file_system::instance();
	xr_reader* r = fs.r_open(PA_MAPS, std::string(name) + ".level");
	if (r == 0)
		return false;

	uint32_t version;
	if (!r->r_chunk<uint32_t>(SCENE_CHUNK_VERSION, version)) {
		msg("no scene version chunk");
		xr_not_expected();
	}
	xr_assert(version == SCENE_VERSION);
	if (version != SCENE_VERSION) {
		msg("unexpected scene version %" PRIu32, version);
		xr_not_expected();
	}

	xr_reader* s = r->open_chunk(SCENE_CHUNK_OPTIONS);
	if (s) {
		load_options(*s);
		r->close_chunk(s);
	} else {
		msg("no level options chunk");
		xr_not_expected();
	}

	if (r->find_chunk(SCENE_CHUNK_CAMERA)) {
		r->r_fvector3(m_camera_pos);
		r->r_fvector3(m_camera_orient);
		r->debug_find_chunk();
	} else {
		msg("no scene camera chunk");
		xr_not_expected();
	}

	if (!r->r_chunk<xr_guid>(TOOLS_CHUNK_GUID, m_guid)) {
		msg("no tools GUID chunk");
		xr_not_expected();
	}

	m_revision.load(*r);

	size_t num_objects = 0;
	if (r->find_chunk(SCENE_CHUNK_COUNT)) {
		num_objects = r->r_u32();
		r->debug_find_chunk();
	}

	load_objects(*r, SCENE_CHUNK_OBJECTS, m_objects);

	if (r->find_chunk(SCENE_CHUNK_SNAP_OBJECTS))
		r->r_seq(r->r_u32(), m_snap_objects, xr_reader::f_r_sz());

	fs.r_close(r);

	std::string parts_path(name);
	parts_path += '\\';
	for (xr_scene_part_vec_it it = m_parts.begin(), end = m_parts.end();
			it != end; ++it) {
		xr_scene_part* part = *it;

		r = fs.r_open(PA_MAPS, parts_path + part->file_name());
		if (r == 0)
			msg("can't load scene part %s", part->file_name());
		xr_assert(r);
		xr_guid guid;
		if (!r->r_chunk<xr_guid>(TOOLS_CHUNK_GUID, guid) || guid != m_guid)
			xr_not_expected();

		xr_reader* s = r->open_chunk(part->chunk_id());
		xr_assert(s);
		if (s) {
			part->load(*s);
			r->close_chunk(s);
		}
		fs.r_close(r);
	}

	return true;
}